

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_259311b::SADx4Test_MaxSrc_Test::TestBody(SADx4Test_MaxSrc_Test *this)

{
  SADTestBase *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  this_00 = &(this->super_SADx4Test).super_SADTestBase;
  SADTestBase::FillConstant
            (this_00,(anonymous_namespace)::SADTestBase::source_data_,
             (this->super_SADx4Test).super_SADTestBase.source_stride_,
             (uint16_t)(this->super_SADx4Test).super_SADTestBase.mask_);
  iVar1 = (*(this->super_SADx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,0);
  SADTestBase::FillConstant
            (this_00,(uint8_t *)CONCAT44(extraout_var,iVar1),
             (this->super_SADx4Test).super_SADTestBase.reference_stride_,0);
  iVar1 = (*(this->super_SADx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,1);
  SADTestBase::FillConstant
            (this_00,(uint8_t *)CONCAT44(extraout_var_00,iVar1),
             (this->super_SADx4Test).super_SADTestBase.reference_stride_,0);
  iVar1 = (*(this->super_SADx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,2);
  SADTestBase::FillConstant
            (this_00,(uint8_t *)CONCAT44(extraout_var_01,iVar1),
             (this->super_SADx4Test).super_SADTestBase.reference_stride_,0);
  iVar1 = (*(this->super_SADx4Test).super_SADTestBase.super_Test._vptr_Test[6])(this_00,3);
  SADTestBase::FillConstant
            (this_00,(uint8_t *)CONCAT44(extraout_var_02,iVar1),
             (this->super_SADx4Test).super_SADTestBase.reference_stride_,0);
  SADx4Test::CheckSADs(&this->super_SADx4Test);
  return;
}

Assistant:

TEST_P(SADx4Test, MaxSrc) {
  FillConstant(source_data_, source_stride_, mask_);
  FillConstant(GetReference(0), reference_stride_, 0);
  FillConstant(GetReference(1), reference_stride_, 0);
  FillConstant(GetReference(2), reference_stride_, 0);
  FillConstant(GetReference(3), reference_stride_, 0);
  CheckSADs();
}